

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadUnix.c
# Opt level: O3

void * startThread(void *entryPtr)

{
  (**(code **)((long)entryPtr + 8))(*(undefined8 *)((long)entryPtr + 0x10));
  return (void *)0x0;
}

Assistant:

static void* startThread (void* entryPtr)
{
	Thread*			thread	= (Thread*)entryPtr;
	deThreadFunc	func	= thread->func;
	void*			arg		= thread->arg;

	/* Start actual thread. */
	func(arg);

	return DE_NULL;
}